

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77_test.cpp
# Opt level: O1

void __thiscall CheckLz77Node::test_method(CheckLz77Node *this)

{
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 *local_128;
  undefined4 *local_120;
  undefined1 local_118 [8];
  undefined8 local_110;
  shared_count sStack_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  undefined4 **local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  undefined4 **local_c8;
  char *local_c0;
  char *local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined8 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2f);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_0010f930;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_120 = &local_12c;
  local_12c = CONCAT31(local_12c._1_3_,0x61);
  local_128 = &local_130;
  local_130 = CONCAT31(local_130._1_3_,0x61);
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_b8 = "";
  local_e8 = &local_120;
  local_f8 = 0;
  local_d8 = 0;
  local_100 = &PTR__lazy_ostream_0010fa68;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = &PTR__lazy_ostream_0010fa68;
  local_c8 = &local_128;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x30);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_0010f930;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_12c = 0x2a;
  local_130 = 0x2a;
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_b8 = "";
  local_120 = &local_12c;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_0010faa8;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_120;
  local_128 = &local_130;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010faa8;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (local_118,&local_b0,&local_c0,0x30,1,2,2,"node.get_offset()",&local_100,"42",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x31);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_0010f930;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_12c = 0x15;
  local_130 = 0x15;
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_b8 = "";
  local_120 = &local_12c;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_0010faa8;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_120;
  local_128 = &local_130;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010faa8;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (local_118,&local_b0,&local_c0,0x31,1,2,2,"node.get_amount()",&local_100,"21",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_108);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckLz77Node) {
  const auto node = Lz77Node('a', 42, 21);

  BOOST_CHECK_EQUAL(node.get_symbol(), 'a');
  BOOST_CHECK_EQUAL(node.get_offset(), 42);
  BOOST_CHECK_EQUAL(node.get_amount(), 21);
}